

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_unarrow_sats(TCGContext_conflict1 *tcg_ctx,int size,TCGv_i32 dest,TCGv_i64 src)

{
  TCGv_i64 src_local;
  TCGv_i32 dest_local;
  int size_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (size == 0) {
    gen_helper_neon_unarrow_sat8(tcg_ctx,dest,tcg_ctx->cpu_env,src);
  }
  else if (size == 1) {
    gen_helper_neon_unarrow_sat16(tcg_ctx,dest,tcg_ctx->cpu_env,src);
  }
  else {
    if (size != 2) {
      abort();
    }
    gen_helper_neon_unarrow_sat32(tcg_ctx,dest,tcg_ctx->cpu_env,src);
  }
  return;
}

Assistant:

static inline void gen_neon_unarrow_sats(TCGContext *tcg_ctx, int size, TCGv_i32 dest, TCGv_i64 src)
{
    switch (size) {
    case 0: gen_helper_neon_unarrow_sat8(tcg_ctx, dest, tcg_ctx->cpu_env, src); break;
    case 1: gen_helper_neon_unarrow_sat16(tcg_ctx, dest, tcg_ctx->cpu_env, src); break;
    case 2: gen_helper_neon_unarrow_sat32(tcg_ctx, dest, tcg_ctx->cpu_env, src); break;
    default: abort();
    }
}